

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_many_nulls.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  QPDFObjectHandle QVar6;
  QPDFObjectHandle QVar7;
  QPDF q;
  allocator<char> local_fa;
  allocator<char> local_f9;
  QPDFObjectHandle page;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0 [3];
  QPDFObjectHandle local_c8;
  QPDFObjectHandle top;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98 [4];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_70 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  QPDFObjectHandle null;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pcVar1 = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(&q);
    QPDF::emptyPDF();
    QPDFObjectHandle::newNull();
    operator____qpdf((char *)&top,0x103019);
    for (iVar3 = 0; iVar3 != 0x14; iVar3 = iVar3 + 1) {
      operator____qpdf((char *)&w,0x103019);
      iVar4 = 20000;
      while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
        QPDFObjectHandle::appendItem((QPDFObjectHandle *)&w);
      }
      QPDFObjectHandle::appendItem(&top);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
    }
    QPDF::getTrailer();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&w,"/Nulls",(allocator<char> *)&local_c8);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&top);
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&q;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&page;
    QPDF::makeIndirectObject(QVar6);
    QPDFObjectHandle::replaceKey(local_a0,(QPDFObjectHandle *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_98);
    operator____qpdf((char *)&page,0x103023);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page);
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&q;
    QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&w;
    QPDF::makeIndirectObject(QVar7);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&page,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    QPDF::getRoot();
    std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Pages",&local_f9);
    QPDFObjectHandle::getKey(local_70);
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"/Kids",&local_fa);
    QPDFObjectHandle::getKey((string *)&local_c8);
    QPDFObjectHandle::appendItem(&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string(local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
    std::__cxx11::string::~string((string *)&w);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
    QPDFWriter::QPDFWriter(&w,&q,pcVar1);
    QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)&w);
    QPDFWriter::setDeterministicID(SUB81(&w,0));
    QPDFWriter::write();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&top.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&null.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    QPDF::~QPDF(&q);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2," outfile.pdf");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    auto whoami = QUtil::getWhoami(argv[0]);
    if (argc != 2) {
        std::cerr << "Usage: " << whoami << " outfile.pdf" << std::endl;
        exit(2);
    }
    char const* outfile = argv[1];

    // Create a file with lots of arrays containing very large numbers
    // of nulls. Prior to qpdf 9.0.0, qpdf had a lot of trouble with
    // this kind of file. This program is used to generate a file that
    // can be used in the test suite and performance benchmarking.
    QPDF q;
    q.emptyPDF();
    auto null = QPDFObjectHandle::newNull();
    auto top = "[]"_qpdf;
    for (int i = 0; i < 20; ++i) {
        auto inner = "[]"_qpdf;
        for (int j = 0; j < 20000; ++j) {
            inner.appendItem(null);
        }
        top.appendItem(inner);
    }
    q.getTrailer().replaceKey("/Nulls", q.makeIndirectObject(top));
    auto page = "<< /Type /Page /MediaBox [0 0 612 792] >>"_qpdf;
    page = q.makeIndirectObject(page);
    q.getRoot().getKey("/Pages").getKey("/Kids").appendItem(page);
    QPDFWriter w(q, outfile);
    w.setObjectStreamMode(qpdf_o_generate);
    w.setDeterministicID(true);
    w.write();
    return 0;
}